

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_add_cdn_domain.cc
# Opt level: O2

int __thiscall
aliyun::Cdn::AddCdnDomain
          (Cdn *this,CdnAddCdnDomainRequestType *req,CdnAddCdnDomainResponseType *response,
          CdnErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_4d4;
  allocator<char> local_4d3;
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  string local_4d0;
  Value val;
  string str_response;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,this->version_,(allocator<char> *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,this->secret_,&local_4d4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_178,&local_198,&local_1b8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,pcVar4,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Action",(allocator<char> *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"AddCdnDomain",&local_4d4)
  ;
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"OwnerId",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_278,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_258,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"ResourceOwnerAccount",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_2b8,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_298,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"ResourceOwnerId",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_2f8,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2d8,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  if ((req->domain_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"DomainName",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_338,(string *)&req->domain_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_318,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_318);
  }
  if ((req->ssl_flag)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"SslFlag",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_378,(string *)&req->ssl_flag);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_358,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_358);
  }
  if ((req->source_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"SourceType",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_3b8,(string *)&req->source_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_398,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_398);
  }
  if ((req->cdn_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"CdnType",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_3f8,(string *)&req->cdn_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3d8,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  if ((req->sources)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"Sources",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string((string *)&local_438,(string *)&req->sources);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_418,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"RegionId",(allocator<char> *)&local_4d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,this->region_id_,&local_4d4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_458,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (CdnErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_4d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4d0,anon_var_dwarf_df3b2 + 9,&local_4d4);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_4d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4d0,anon_var_dwarf_df3b2 + 9,&local_4d1);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_4d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4d0,anon_var_dwarf_df3b2 + 9,&local_4d2);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_4d0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4d0,anon_var_dwarf_df3b2 + 9,&local_4d3);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
      }
      goto LAB_0012a662;
    }
  }
  iVar2 = -1;
  if (error_info != (CdnErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0012a662:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Cdn::AddCdnDomain(const CdnAddCdnDomainRequestType& req,
                      CdnAddCdnDomainResponseType* response,
                       CdnErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","AddCdnDomain");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.domain_name.empty()) {
    req_rpc->AddRequestQuery("DomainName", req.domain_name);
  }
  if(!req.ssl_flag.empty()) {
    req_rpc->AddRequestQuery("SslFlag", req.ssl_flag);
  }
  if(!req.source_type.empty()) {
    req_rpc->AddRequestQuery("SourceType", req.source_type);
  }
  if(!req.cdn_type.empty()) {
    req_rpc->AddRequestQuery("CdnType", req.cdn_type);
  }
  if(!req.sources.empty()) {
    req_rpc->AddRequestQuery("Sources", req.sources);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}